

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest_rewriter.cpp
# Opt level: O2

void __thiscall duckdb::UnnestRewriter::GetLHSExpressions(UnnestRewriter *this,LogicalOperator *op)

{
  LogicalProjection *pLVar1;
  reference __args;
  reference __args_1;
  reference this_00;
  reference pvVar2;
  idx_t i;
  ulong __n;
  bool bVar3;
  vector<duckdb::ColumnBinding,_true> col_bindings;
  
  LogicalOperator::ResolveOperatorTypes(op);
  (*op->_vptr_LogicalOperator[2])(&col_bindings,op);
  if (op->type == LOGICAL_PROJECTION) {
    pLVar1 = LogicalOperator::Cast<duckdb::LogicalProjection>(op);
    bVar3 = (long)(pLVar1->super_LogicalOperator).expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pLVar1->super_LogicalOperator).expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 ==
            ((long)(op->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(op->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18;
  }
  else {
    bVar3 = false;
  }
  for (__n = 0; __n < (ulong)(((long)(op->types).
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(op->types).
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    __args = vector<duckdb::ColumnBinding,_true>::get<true>(&col_bindings,__n);
    __args_1 = vector<duckdb::LogicalType,_true>::get<true>(&op->types,__n);
    ::std::vector<duckdb::LHSBinding,std::allocator<duckdb::LHSBinding>>::
    emplace_back<duckdb::ColumnBinding&,duckdb::LogicalType&>
              ((vector<duckdb::LHSBinding,std::allocator<duckdb::LHSBinding>> *)&this->lhs_bindings,
               __args,__args_1);
    if (bVar3) {
      pLVar1 = LogicalOperator::Cast<duckdb::LogicalProjection>(op);
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&(pLVar1->super_LogicalOperator).expressions,__n);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                (this_00);
      pvVar2 = vector<duckdb::LHSBinding,_true>::back(&this->lhs_bindings);
      ::std::__cxx11::string::_M_assign((string *)&pvVar2->alias);
    }
  }
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &col_bindings);
  return;
}

Assistant:

void UnnestRewriter::GetLHSExpressions(LogicalOperator &op) {

	op.ResolveOperatorTypes();
	auto col_bindings = op.GetColumnBindings();
	D_ASSERT(op.types.size() == col_bindings.size());

	bool set_alias = false;
	// we can easily extract the alias for LOGICAL_PROJECTION(s)
	if (op.type == LogicalOperatorType::LOGICAL_PROJECTION) {
		auto &proj = op.Cast<LogicalProjection>();
		if (proj.expressions.size() == op.types.size()) {
			set_alias = true;
		}
	}

	for (idx_t i = 0; i < op.types.size(); i++) {
		lhs_bindings.emplace_back(col_bindings[i], op.types[i]);
		if (set_alias) {
			auto &proj = op.Cast<LogicalProjection>();
			lhs_bindings.back().alias = proj.expressions[i]->GetAlias();
		}
	}
}